

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int dmrC_test_parse(void)

{
  token **pptVar1;
  dmr_C *C;
  size_t size;
  token *ptVar2;
  char *pcVar3;
  long lVar4;
  uchar *puVar5;
  token *ptVar6;
  byte bVar7;
  uchar local_98 [8];
  char test1 [100];
  token *end;
  
  bVar7 = 0;
  C = new_dmr_C();
  pcVar3 = 
  "extern int printf(const char *, ...); int main() { printf(\"hello world!\\n\"); return 0; }";
  puVar5 = local_98;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)puVar5 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + ((ulong)bVar7 * -2 + 1) * 8;
    puVar5 = puVar5 + (ulong)bVar7 * -0x10 + 8;
  }
  test1[0x58] = '\0';
  test1[0x59] = '\0';
  test1[0x5a] = '\0';
  test1[0x5b] = '\0';
  size = strlen((char *)local_98);
  ptVar2 = dmrC_tokenize_buffer(C,local_98,size,(token **)(test1 + 0x60));
  ptVar6 = ptVar2;
  if (ptVar2 != &dmrC_eof_token_entry_) {
    do {
      pcVar3 = dmrC_show_token(C,ptVar6);
      puts(pcVar3);
      pptVar1 = &ptVar6->next;
      ptVar6 = *pptVar1;
    } while (*pptVar1 != &dmrC_eof_token_entry_);
  }
  putchar(10);
  ptVar2 = dmrC_preprocess(C,ptVar2);
  ptVar6 = ptVar2;
  if (ptVar2 != &dmrC_eof_token_entry_) {
    do {
      pcVar3 = dmrC_show_token(C,ptVar6);
      puts(pcVar3);
      pptVar1 = &ptVar6->next;
      ptVar6 = *pptVar1;
    } while (*pptVar1 != &dmrC_eof_token_entry_);
  }
  if (ptVar2 != &dmrC_eof_token_entry_) {
    do {
      ptVar2 = dmrC_external_declaration
                         (C,ptVar2,&C->S->translation_unit_used_list,(validate_decl_t)0x0);
    } while (ptVar2 != &dmrC_eof_token_entry_);
  }
  dmrC_show_symbol_list(C,C->S->translation_unit_used_list,"\n\n");
  destroy_dmr_C(C);
  return 0;
}

Assistant:

int dmrC_test_parse() {
	struct dmr_C *C = new_dmr_C();
	char test1[100] = "extern int printf(const char *, ...); int main() { printf(\"hello world!\\n\"); return 0; }";
	struct token *start;
	struct token *end;
	start = dmrC_tokenize_buffer(C, (unsigned char *)test1,
		(unsigned long)strlen(test1), &end);
	for (struct token *p = start; !dmrC_eof_token(p); p = p->next) {
		printf("%s\n", dmrC_show_token(C, p));
	}
	printf("\n");
	start = dmrC_preprocess(C, start);
	for (struct token *p = start; !dmrC_eof_token(p); p = p->next) {
		printf("%s\n", dmrC_show_token(C, p));
	}
	while (!dmrC_eof_token(start))
		start = dmrC_external_declaration(C, start, &C->S->translation_unit_used_list, NULL);
	dmrC_show_symbol_list(C, C->S->translation_unit_used_list, "\n\n");
	destroy_dmr_C(C);
	return 0;
}